

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int aead_do_decrypt(ptls_aead_context_t *_ctx,void *_output,size_t *outlen,void *input,size_t inlen,
                   void *iv,uint8_t unused)

{
  int iVar1;
  int local_54;
  uchar *puStack_50;
  int blocklen;
  uint8_t *output;
  aead_crypto_context_t *ctx;
  void *iv_local;
  size_t inlen_local;
  void *input_local;
  size_t *outlen_local;
  void *_output_local;
  ptls_aead_context_t *_ctx_local;
  
  *outlen = 0;
  if (inlen < _ctx[1].seq) {
    _ctx_local._4_4_ = 0x14;
  }
  else {
    puStack_50 = (uchar *)_output;
    output = (uint8_t *)_ctx;
    ctx = (aead_crypto_context_t *)iv;
    iv_local = (void *)inlen;
    inlen_local = (size_t)input;
    input_local = outlen;
    outlen_local = (size_t *)_output;
    _output_local = _ctx;
    iVar1 = EVP_DecryptInit_ex((EVP_CIPHER_CTX *)_ctx[1].algo,(EVP_CIPHER *)0x0,(ENGINE *)0x0,
                               (uchar *)0x0,(uchar *)iv);
    if (iVar1 == 0) {
      _ctx_local._4_4_ = 0x203;
    }
    else {
      iVar1 = EVP_DecryptUpdate(*(EVP_CIPHER_CTX **)(output + 0x30),puStack_50,&local_54,
                                (uchar *)inlen_local,
                                (int)iv_local - (int)*(undefined8 *)(output + 0x38));
      if (iVar1 == 0) {
        _ctx_local._4_4_ = 0x203;
      }
      else {
        *(long *)input_local = (long)local_54 + *input_local;
        iVar1 = EVP_CIPHER_CTX_ctrl(*(EVP_CIPHER_CTX **)(output + 0x30),0x11,
                                    (int)*(undefined8 *)(output + 0x38),
                                    (void *)((long)iv_local +
                                            (inlen_local - *(long *)(output + 0x38))));
        if (iVar1 == 0) {
          _ctx_local._4_4_ = 0x203;
        }
        else {
          iVar1 = EVP_DecryptFinal_ex(*(EVP_CIPHER_CTX **)(output + 0x30),puStack_50 + *input_local,
                                      &local_54);
          if (iVar1 == 0) {
            _ctx_local._4_4_ = 0x14;
          }
          else {
            *(long *)input_local = (long)local_54 + *input_local;
            _ctx_local._4_4_ = 0;
          }
        }
      }
    }
  }
  return _ctx_local._4_4_;
}

Assistant:

static int aead_do_decrypt(ptls_aead_context_t *_ctx, void *_output, size_t *outlen, const void *input, size_t inlen,
                           const void *iv, uint8_t unused)
{
    struct aead_crypto_context_t *ctx = (struct aead_crypto_context_t *)_ctx;
    uint8_t *output = _output;
    int blocklen;

    *outlen = 0;

    if (inlen < ctx->tag_size)
        return PTLS_ALERT_BAD_RECORD_MAC;

    if (!EVP_DecryptInit_ex(ctx->evp_ctx, NULL, NULL, NULL, iv))
        return PTLS_ERROR_LIBRARY;
    if (!EVP_DecryptUpdate(ctx->evp_ctx, output, &blocklen, input, (int)(inlen - ctx->tag_size)))
        return PTLS_ERROR_LIBRARY;
    *outlen += blocklen;
    if (!EVP_CIPHER_CTX_ctrl(ctx->evp_ctx, EVP_CTRL_GCM_SET_TAG, (int)ctx->tag_size,
                             (void *)((uint8_t *)input + inlen - ctx->tag_size)))
        return PTLS_ERROR_LIBRARY;
    if (!EVP_DecryptFinal_ex(ctx->evp_ctx, output + *outlen, &blocklen))
        return PTLS_ALERT_BAD_RECORD_MAC;
    *outlen += blocklen;

    return 0;
}